

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall
google::protobuf::UnknownFieldSet::MergeFromAndDestroy(UnknownFieldSet *this,UnknownFieldSet *other)

{
  vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *this_00;
  iterator __position;
  pointer pUVar1;
  anon_union_8_5_912831f5_for_data_ aVar2;
  uint32 uVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  UnknownField *__args;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  pvVar4 = other->fields_;
  if (pvVar4 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    uVar6 = (uint)((ulong)((long)(pvVar4->
                                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar4->
                                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 4);
    if (0 < (int)uVar6) {
      if (this->fields_ ==
          (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *
          )0x0) {
        pvVar4 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)operator_new(0x18);
        (pvVar4->
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar4->
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar4->
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this->fields_ = pvVar4;
      }
      uVar7 = (ulong)(uVar6 & 0x7fffffff);
      lVar5 = 0;
      do {
        this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
                   *)this->fields_;
        __args = (UnknownField *)
                 ((long)&((other->fields_->
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          )._M_impl.super__Vector_impl_data._M_start)->number_ + lVar5);
        __position._M_current = *(UnknownField **)(this_00 + 8);
        if (__position._M_current == *(UnknownField **)(this_00 + 0x10)) {
          std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
          ::_M_realloc_insert<google::protobuf::UnknownField_const&>(this_00,__position,__args);
        }
        else {
          uVar3 = __args->type_;
          aVar2 = __args->data_;
          (__position._M_current)->number_ = __args->number_;
          (__position._M_current)->type_ = uVar3;
          (__position._M_current)->data_ = aVar2;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
        }
        pUVar1 = (other->fields_->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*(int *)((long)&pUVar1->type_ + lVar5) - 3U < 2) {
          *(undefined8 *)((long)&pUVar1->data_ + lVar5) = 0;
        }
        lVar5 = lVar5 + 0x10;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    pvVar4 = other->fields_;
    if (pvVar4 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      pUVar1 = (pvVar4->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pUVar1 != (pointer)0x0) {
        operator_delete(pUVar1,(long)(pvVar4->
                                     super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pUVar1);
      }
      goto LAB_005c968b;
    }
  }
  pvVar4 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)0x0;
LAB_005c968b:
  operator_delete(pvVar4,0x18);
  other->fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  return;
}

Assistant:

void UnknownFieldSet::MergeFromAndDestroy(UnknownFieldSet* other) {
  int other_field_count = other->field_count();
  if (other_field_count > 0) {
    if (fields_ == NULL) fields_ = new std::vector<UnknownField>();
    for (int i = 0; i < other_field_count; i++) {
      fields_->push_back((*other->fields_)[i]);
      (*other->fields_)[i].Reset();
    }
  }
  delete other->fields_;
  other->fields_ = NULL;
}